

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionPushConstant
          (ValidationState_t *_,Instruction *inst)

{
  Instruction *__00;
  bool bVar1;
  uint uVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_3d0;
  DiagnosticStream local_1f8;
  Instruction *local_20;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  local_20 = inst;
  inst_local = (Instruction *)_;
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar1 = IsUint32Constant(_,uVar2);
  __00 = inst_local;
  if (bVar1) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(local_20,5);
    bVar1 = IsUint32Constant((ValidationState_t *)__00,uVar2);
    if (bVar1) {
      __local._4_4_ = SPV_SUCCESS;
    }
    else {
      ValidationState_t::diag
                (&local_3d0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
      pDVar3 = DiagnosticStream::operator<<(&local_3d0,(char (*) [50])0x63b698);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_3d0);
    }
  }
  else {
    ValidationState_t::diag
              (&local_1f8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,local_20);
    pDVar3 = DiagnosticStream::operator<<(&local_1f8,(char (*) [52])0x63b814);
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream(&local_1f8);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateClspvReflectionPushConstant(ValidationState_t& _,
                                                 const Instruction* inst) {
  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(4))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Offset must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Size must be a 32-bit unsigned integer OpConstant";
  }

  return SPV_SUCCESS;
}